

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_paged_audio_buffer_get_length_in_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 *pLength)

{
  ma_paged_audio_buffer_data *pmVar1;
  ma_result mVar2;
  ma_paged_audio_buffer_page *pmVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (pLength != (ma_uint64 *)0x0) {
    pmVar1 = pPagedAudioBuffer->pData;
    *pLength = 0;
    if (pmVar1 != (ma_paged_audio_buffer_data *)0x0) {
      mVar2 = MA_SUCCESS;
      for (pmVar3 = (pmVar1->head).pNext; pmVar3 != (ma_paged_audio_buffer_page *)0x0;
          pmVar3 = pmVar3->pNext) {
        *pLength = *pLength + pmVar3->sizeInFrames;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_get_length_in_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64* pLength)
{
    return ma_paged_audio_buffer_data_get_length_in_pcm_frames(pPagedAudioBuffer->pData, pLength);
}